

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_text(nk_text_edit *state,char *text,int total_len)

{
  int iVar1;
  int local_28;
  int local_24;
  int text_len;
  int glyph_len;
  nk_rune unicode;
  int total_len_local;
  char *text_local;
  nk_text_edit *state_local;
  
  local_28 = 0;
  glyph_len = total_len;
  _unicode = text;
  text_local = (char *)state;
  if (state == (nk_text_edit *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5625,"void nk_textedit_text(struct nk_text_edit *, const char *, int)");
  }
  if (text == (char *)0x0) {
    __assert_fail("text",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5626,"void nk_textedit_text(struct nk_text_edit *, const char *, int)");
  }
  if (((text != (char *)0x0) && (total_len != 0)) && (state->mode != '\0')) {
    local_24 = nk_utf_decode(text,(nk_rune *)&text_len,total_len);
    while (local_28 < glyph_len && local_24 != 0) {
      if (((text_len != 0x7f) && ((text_len != 10 || (text_local[0xb8] == '\0')))) &&
         ((*(long *)(text_local + 0x98) == 0 ||
          (iVar1 = (**(code **)(text_local + 0x98))(text_local,text_len), iVar1 != 0)))) {
        if ((*(int *)(text_local + 0xac) == *(int *)(text_local + 0xb0)) &&
           (*(int *)(text_local + 0xa8) < *(int *)(text_local + 0x90))) {
          if (text_local[0xb4] == '\x02') {
            nk_textedit_makeundo_replace((nk_text_edit *)text_local,*(int *)(text_local + 0xa8),1,1)
            ;
            nk_str_delete_runes((nk_str *)(text_local + 0x18),*(int *)(text_local + 0xa8),1);
          }
          iVar1 = nk_str_insert_text_utf8
                            ((nk_str *)(text_local + 0x18),*(int *)(text_local + 0xa8),
                             _unicode + local_28,1);
          if (iVar1 != 0) {
            *(int *)(text_local + 0xa8) = *(int *)(text_local + 0xa8) + 1;
            text_local[0xb7] = '\0';
          }
        }
        else {
          nk_textedit_delete_selection((nk_text_edit *)text_local);
          iVar1 = nk_str_insert_text_utf8
                            ((nk_str *)(text_local + 0x18),*(int *)(text_local + 0xa8),
                             _unicode + local_28,1);
          if (iVar1 != 0) {
            nk_textedit_makeundo_insert((nk_text_edit *)text_local,*(int *)(text_local + 0xa8),1);
            *(int *)(text_local + 0xa8) = *(int *)(text_local + 0xa8) + 1;
            text_local[0xb7] = '\0';
          }
        }
      }
      local_28 = local_24 + local_28;
      local_24 = nk_utf_decode(_unicode + local_28,(nk_rune *)&text_len,glyph_len - local_28);
    }
  }
  return;
}

Assistant:

NK_API void
nk_textedit_text(struct nk_text_edit *state, const char *text, int total_len)
{
    nk_rune unicode;
    int glyph_len;
    int text_len = 0;

    NK_ASSERT(state);
    NK_ASSERT(text);
    if (!text || !total_len || state->mode == NK_TEXT_EDIT_MODE_VIEW) return;

    glyph_len = nk_utf_decode(text, &unicode, total_len);
    while ((text_len < total_len) && glyph_len)
    {
        /* don't insert a backward delete, just process the event */
        if (unicode == 127) goto next;
        /* can't add newline in single-line mode */
        if (unicode == '\n' && state->single_line) goto next;
        /* filter incoming text */
        if (state->filter && !state->filter(state, unicode)) goto next;

        if (!NK_TEXT_HAS_SELECTION(state) &&
            state->cursor < state->string.len)
        {
            if (state->mode == NK_TEXT_EDIT_MODE_REPLACE) {
                nk_textedit_makeundo_replace(state, state->cursor, 1, 1);
                nk_str_delete_runes(&state->string, state->cursor, 1);
            }
            if (nk_str_insert_text_utf8(&state->string, state->cursor,
                                        text+text_len, 1))
            {
                ++state->cursor;
                state->has_preferred_x = 0;
            }
        } else {
            nk_textedit_delete_selection(state); /* implicitly clamps */
            if (nk_str_insert_text_utf8(&state->string, state->cursor,
                                        text+text_len, 1))
            {
                nk_textedit_makeundo_insert(state, state->cursor, 1);
                ++state->cursor;
                state->has_preferred_x = 0;
            }
        }
        next:
        text_len += glyph_len;
        glyph_len = nk_utf_decode(text + text_len, &unicode, total_len-text_len);
    }
}